

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::focusOutEvent(QWidget *this,QFocusEvent *param_1)

{
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  
  pQVar1 = this->data;
  if (((pQVar1->field_0x10 & 0xf0) != 0) ||
     (((pQVar1->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    auVar2._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    auVar2._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    auVar2._8_8_ = 0;
    QWidgetPrivate::update<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar2 << 0x40));
  }
  bVar3 = QApplication::autoSipEnabled(QCoreApplication::self);
  if ((bVar3) && ((this->data->widget_attributes & 0x4000) != 0)) {
    QGuiApplication::inputMethod();
    QInputMethod::hide();
    return;
  }
  return;
}

Assistant:

void QWidget::focusOutEvent(QFocusEvent *)
{
    if (focusPolicy() != Qt::NoFocus || !isWindow())
        update();

#if !defined(QT_PLATFORM_UIKIT)
    // FIXME: revisit autoSIP logic, QTBUG-42906
    if (qApp->autoSipEnabled() && testAttribute(Qt::WA_InputMethodEnabled))
        QGuiApplication::inputMethod()->hide();
#endif
}